

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

bool Guest_WaitForOthers(void *userdata)

{
  int iVar1;
  sockaddr_in *address;
  in_addr *piVar2;
  ulong uVar3;
  PreGamePacket packet;
  
  while (address = PreGet(&packet,0x44,false), address != (sockaddr_in *)0x0) {
    if ((packet.Fake == '0') && (iVar1 = FindNode(address), iVar1 == 1)) {
      switch(packet.Message) {
      case '\x02':
        I_FatalError("The host cancelled the game.");
        break;
      case '\x03':
        if (doomcom.numnodes == 2) {
          doomcom.numnodes = packet.NumNodes + 2;
          sendplayer[0] = packet.field_3.ConsoleNum;
          doomcom.consoleplayer = (SWORD)packet.field_3.ConsoleNum;
          (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Console player number: %d");
          piVar2 = &sendaddress[2].sin_addr;
          for (uVar3 = 0; packet.NumNodes != uVar3; uVar3 = uVar3 + 1) {
            piVar2->s_addr = packet.machines[uVar3].address;
            ((sockaddr_in *)(piVar2 + -1))->sin_port = packet.machines[uVar3].port;
            sendplayer[uVar3 + 2] = packet.machines[uVar3].player;
            ((sockaddr_in *)(piVar2 + -1))->sin_family = 2;
            piVar2 = piVar2 + 4;
          }
        }
        (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Received All Here, sending ACK.");
        packet.Fake = '0';
        packet.Message = '\x06';
        PreSend(&packet,2,sendaddress + 1);
        break;
      case '\x04':
        (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,(ulong)packet.field_3.ConsoleNum);
        break;
      case '\a':
        (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Received \"Go.\"");
LAB_00466aba:
        return address != (sockaddr_in *)0x0;
      }
    }
  }
  packet.Fake = '0';
  packet.Message = '\x01';
  PreSend(&packet,2,sendaddress + 1);
  goto LAB_00466aba;
}

Assistant:

bool Guest_WaitForOthers (void *userdata)
{
	sockaddr_in *from;
	PreGamePacket packet;

	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake != PRE_FAKE || FindNode(from) != 1)
		{
			continue;
		}
		switch (packet.Message)
		{
		case PRE_CONACK:
			StartScreen->NetProgress (packet.NumPresent);
			break;

		case PRE_ALLHERE:
			if (doomcom.numnodes == 2)
			{
				int node;

				doomcom.numnodes = packet.NumNodes + 2;
				sendplayer[0] = packet.ConsoleNum;	// My player number
				doomcom.consoleplayer = packet.ConsoleNum;
				StartScreen->NetMessage ("Console player number: %d", doomcom.consoleplayer);
				for (node = 0; node < packet.NumNodes; node++)
				{
					sendaddress[node+2].sin_addr.s_addr = packet.machines[node].address;
					sendaddress[node+2].sin_port = packet.machines[node].port;
					sendplayer[node+2] = packet.machines[node].player;

					// [JC] - fixes problem of games not starting due to
					// no address family being assigned to nodes stored in
					// sendaddress[] from the All Here packet.
					sendaddress[node+2].sin_family = AF_INET;
				}
			}

			StartScreen->NetMessage ("Received All Here, sending ACK.");
			packet.Fake = PRE_FAKE;
			packet.Message = PRE_ALLHEREACK;
			PreSend (&packet, 2, &sendaddress[1]);
			break;

		case PRE_GO:
			StartScreen->NetMessage ("Received \"Go.\"");
			return true;

		case PRE_DISCONNECT:
			I_FatalError ("The host cancelled the game.");
			break;
		}
	}

	packet.Fake = PRE_FAKE;
	packet.Message = PRE_KEEPALIVE;
	PreSend(&packet, 2, &sendaddress[1]);

	return false;
}